

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O2

void __thiscall
QExplicitlySharedDataPointer<QRawFontPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QRawFontPrivate> *this)

{
  QAtomicInt *pQVar1;
  QRawFontPrivate *this_00;
  int iVar2;
  undefined4 extraout_var;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  void *in_R8;
  
  iVar2 = clone(this,in_RSI,in_RDX,in_ECX,in_R8);
  LOCK();
  pQVar1 = &((QRawFontPrivate *)CONCAT44(extraout_var,iVar2))->ref;
  (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar1 = &((this->d).ptr)->ref;
  (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    this_00 = (this->d).ptr;
    if (this_00 != (QRawFontPrivate *)0x0) {
      QRawFontPrivate::cleanUp(this_00);
    }
    operator_delete(this_00,0x18);
  }
  (this->d).ptr = (QRawFontPrivate *)CONCAT44(extraout_var,iVar2);
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}